

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O1

void __thiscall
Assimp::ValidateDSProcess::Validate
          (ValidateDSProcess *this,aiMesh *pMesh,aiBone *pBone,float *afSum)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  
  Validate(this,&pBone->mName);
  if (pBone->mNumWeights != 0) {
    uVar3 = 0;
    do {
      if (pMesh->mNumVertices <= pBone->mWeights[uVar3].mVertexId) {
        ReportError(this,"aiBone::mWeights[%i].mVertexId is out of range",uVar3 & 0xffffffff);
      }
      fVar1 = pBone->mWeights[uVar3].mWeight;
      if (((fVar1 == 0.0) && (!NAN(fVar1))) || (1.0 < fVar1)) {
        ReportWarning(this,"aiBone::mWeights[%i].mWeight has an invalid value",uVar3 & 0xffffffff);
      }
      uVar2 = pBone->mWeights[uVar3].mVertexId;
      afSum[uVar2] = pBone->mWeights[uVar3].mWeight + afSum[uVar2];
      uVar3 = uVar3 + 1;
    } while ((uint)uVar3 < pBone->mNumWeights);
  }
  return;
}

Assistant:

void ValidateDSProcess::Validate( const aiMesh* pMesh, const aiBone* pBone,float* afSum) {
    this->Validate(&pBone->mName);

    if (!pBone->mNumWeights)    {
        //ReportError("aiBone::mNumWeights is zero");
    }

    // check whether all vertices affected by this bone are valid
    for (unsigned int i = 0; i < pBone->mNumWeights;++i)
    {
        if (pBone->mWeights[i].mVertexId >= pMesh->mNumVertices)    {
            ReportError("aiBone::mWeights[%i].mVertexId is out of range",i);
        }
        else if (!pBone->mWeights[i].mWeight || pBone->mWeights[i].mWeight > 1.0f)  {
            ReportWarning("aiBone::mWeights[%i].mWeight has an invalid value",i);
        }
        afSum[pBone->mWeights[i].mVertexId] += pBone->mWeights[i].mWeight;
    }
}